

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

size_t pe_util::getAsciiLenW(WORD *inp,size_t maxInp,bool acceptNotTerminated)

{
  WORD WVar1;
  size_t i;
  size_t sVar2;
  
  for (i = 0; sVar2 = maxInp, maxInp != i; i = i + 1) {
    WVar1 = inp[i];
    if (WVar1 == 0) {
      return i;
    }
    if (((0x5e < (ushort)(WVar1 - 0x20)) && (WVar1 != 0xd)) && (sVar2 = i, WVar1 != 10)) break;
  }
  if (!acceptNotTerminated) {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t pe_util::getAsciiLenW(const WORD *inp, size_t maxInp, bool acceptNotTerminated)
{
    size_t i = 0;
    for (; i < maxInp; i++) {
        const WORD w = inp[i];
        if (w == 0) return i; //end of string
        if (!IS_PRINTABLE(w) && !IS_ENDLINE(w)) break;
    }
    if (acceptNotTerminated) return i;
    return 0;
}